

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rand.c
# Opt level: O2

CURLcode Curl_rand_hex(Curl_easy *data,uchar *rnd,size_t num)

{
  byte bVar1;
  CURLcode CVar2;
  size_t sVar3;
  uchar *bufp;
  byte *pbVar4;
  uchar buffer [128];
  
  if ((num & 0xffffffffffffff01) == 1) {
    pbVar4 = buffer;
    CVar2 = Curl_rand(data,buffer,num - 1 >> 1);
    if (CVar2 == CURLE_OK) {
      for (sVar3 = 1; num != sVar3; sVar3 = sVar3 + 2) {
        bVar1 = *pbVar4;
        rnd[sVar3 - 1] = "0123456789abcdef"[bVar1 >> 4];
        rnd[sVar3] = "0123456789abcdef"[bVar1 & 0xf];
        pbVar4 = pbVar4 + 1;
      }
      rnd[sVar3 - 1] = '\0';
      CVar2 = CURLE_OK;
    }
    return CVar2;
  }
  return CURLE_BAD_FUNCTION_ARGUMENT;
}

Assistant:

CURLcode Curl_rand_hex(struct Curl_easy *data, unsigned char *rnd,
                       size_t num)
{
  CURLcode result = CURLE_BAD_FUNCTION_ARGUMENT;
  const char *hex = "0123456789abcdef";
  unsigned char buffer[128];
  unsigned char *bufp = buffer;
  DEBUGASSERT(num > 1);

#ifdef __clang_analyzer__
  /* This silences a scan-build warning about accessing this buffer with
     uninitialized memory. */
  memset(buffer, 0, sizeof(buffer));
#endif

  if((num/2 >= sizeof(buffer)) || !(num&1))
    /* make sure it fits in the local buffer and that it is an odd number! */
    return CURLE_BAD_FUNCTION_ARGUMENT;

  num--; /* save one for null-termination */

  result = Curl_rand(data, buffer, num/2);
  if(result)
    return result;

  while(num) {
    /* clang-tidy warns on this line without this comment: */
    /* NOLINTNEXTLINE(clang-analyzer-core.UndefinedBinaryOperatorResult) */
    *rnd++ = hex[(*bufp & 0xF0)>>4];
    *rnd++ = hex[*bufp & 0x0F];
    bufp++;
    num -= 2;
  }
  *rnd = 0;

  return result;
}